

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes SkipBitUi32s(CSzData *sd,UInt32 numItems)

{
  Byte *pBVar1;
  ulong uVar2;
  SRes SVar3;
  ulong uVar4;
  Byte *bits;
  bool bVar5;
  
  SVar3 = 0x10;
  if (sd->Size != 0) {
    uVar4 = sd->Size - 1;
    sd->Size = uVar4;
    pBVar1 = sd->Data;
    bits = pBVar1 + 1;
    sd->Data = bits;
    if (*pBVar1 == '\0') {
      uVar2 = (ulong)(numItems + 7 >> 3);
      bVar5 = uVar4 < uVar2;
      uVar4 = uVar4 - uVar2;
      if (bVar5) {
        return 0x10;
      }
      numItems = CountDefinedBits(bits,numItems);
      sd->Size = uVar4;
      bits = bits + uVar2;
      sd->Data = bits;
    }
    uVar2 = (ulong)numItems;
    if (uVar2 <= uVar4 >> 2) {
      sd->Size = uVar4 + uVar2 * -4;
      sd->Data = bits + uVar2 * 4;
      SVar3 = 0;
    }
  }
  return SVar3;
}

Assistant:

static SRes SkipBitUi32s(CSzData *sd, UInt32 numItems)
{
  Byte allAreDefined;
  UInt32 numDefined = numItems;
  SZ_READ_BYTE(allAreDefined);
  if (!allAreDefined)
  {
    size_t numBytes = (numItems + 7) >> 3;
    if (numBytes > sd->Size)
      return SZ_ERROR_ARCHIVE;
    numDefined = CountDefinedBits(sd->Data, numItems);
    SKIP_DATA(sd, numBytes);
  }
  if (numDefined > (sd->Size >> 2))
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, (size_t)numDefined * 4);
  return SZ_OK;
}